

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O1

ncnn_datareader_t ncnn_datareader_create_from_memory(uchar **mem)

{
  ncnn_datareader_t p_Var1;
  DataReaderFromMemory *this;
  
  p_Var1 = (ncnn_datareader_t)malloc(0x18);
  this = (DataReaderFromMemory *)operator_new(0x18);
  ncnn::DataReaderFromMemory::DataReaderFromMemory(this,mem);
  (this->super_DataReader)._vptr_DataReader = (_func_int **)&PTR__DataReaderFromMemory_00353600;
  this[1].super_DataReader._vptr_DataReader = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->scan = __ncnn_DataReaderFromMemory_scan;
  p_Var1->read = __ncnn_DataReaderFromMemory_read;
  return p_Var1;
}

Assistant:

ncnn_datareader_t ncnn_datareader_create_from_memory(const unsigned char** mem)
{
    ncnn_datareader_t dr = (ncnn_datareader_t)malloc(sizeof(struct __ncnn_datareader_t));
    dr->pthis = (void*)(new DataReaderFromMemory_c_api(*mem, dr));
#if NCNN_STRING
    dr->scan = __ncnn_DataReaderFromMemory_scan;
#endif /* NCNN_STRING */
    dr->read = __ncnn_DataReaderFromMemory_read;
    return dr;
}